

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::runCompute
          (InterInvocationTestCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  int local_20;
  int local_1c;
  int groupsY;
  int groupsX;
  Functions *gl;
  InterInvocationTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _groupsY = CONCAT44(extraout_var,iVar2);
  local_1c = this->m_workWidth / this->m_localWidth;
  local_20 = this->m_workHeight / this->m_localHeight;
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [22])"Dispatching compute.\n");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])"\tgroup size: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_localWidth);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a8224a);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_localHeight);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])"\tdispatch size: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a8224a);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])"\ttotal work size: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_workWidth);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a8224a);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_workHeight);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  pcVar1 = *(code **)(_groupsY + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar1)(dVar3);
  if ((this->m_storage == STORAGE_BUFFER) && ((this->m_aliasingStorages & 1U) == 0)) {
    (**(code **)(_groupsY + 0x48))(0x90d2,1,this->m_storageBuf);
    dVar3 = (**(code **)(_groupsY + 0x800))();
    glu::checkError(dVar3,"bind source buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x153);
  }
  else if ((this->m_storage == STORAGE_BUFFER) && ((this->m_aliasingStorages & 1U) != 0)) {
    (**(code **)(_groupsY + 0x48))(0x90d2,1,this->m_storageBuf);
    (**(code **)(_groupsY + 0x48))(0x90d2,2,this->m_storageBuf);
    dVar3 = (**(code **)(_groupsY + 0x800))();
    glu::checkError(dVar3,"bind source buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x159);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_330,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_330,(char (*) [47])"Binding same buffer object to buffer storages.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
  }
  else if ((this->m_storage == STORAGE_IMAGE) && ((this->m_aliasingStorages & 1U) == 0)) {
    (**(code **)(_groupsY + 0x80))(1,this->m_storageTex,0,0,0,0x88ba,0x8235);
    dVar3 = (**(code **)(_groupsY + 0x800))();
    glu::checkError(dVar3,"bind result buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x160);
  }
  else if ((this->m_storage == STORAGE_IMAGE) && ((this->m_aliasingStorages & 1U) != 0)) {
    (**(code **)(_groupsY + 0x80))(1,this->m_storageTex,0,0,0,0x88ba,0x8235);
    (**(code **)(_groupsY + 0x80))(2,this->m_storageTex,0,0,0,0x88ba,0x8235);
    dVar3 = (**(code **)(_groupsY + 0x800))();
    glu::checkError(dVar3,"bind result buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x167);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4b0,(char (*) [46])"Binding same texture level to image storages.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  }
  (**(code **)(_groupsY + 0x48))(0x90d2,0,this->m_resultBuf);
  dVar3 = (**(code **)(_groupsY + 0x800))();
  glu::checkError(dVar3,"bind result buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x170);
  (**(code **)(_groupsY + 0x528))(local_1c,local_20,1);
  dVar3 = (**(code **)(_groupsY + 0x800))();
  glu::checkError(dVar3,"dispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x174);
  return;
}

Assistant:

void InterInvocationTestCase::runCompute (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	const int				groupsX	= m_workWidth / m_localWidth;
	const int				groupsY	= m_workHeight / m_localHeight;

	DE_ASSERT((m_workWidth % m_localWidth) == 0);
	DE_ASSERT((m_workHeight % m_localHeight) == 0);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Dispatching compute.\n"
		<< "	group size: " << m_localWidth << "x" << m_localHeight << "\n"
		<< "	dispatch size: " << groupsX << "x" << groupsY << "\n"
		<< "	total work size: " << m_workWidth << "x" << m_workHeight << "\n"
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_program->getProgram());

	// source
	if (m_storage == STORAGE_BUFFER && !m_aliasingStorages)
	{
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageBuf);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buf");
	}
	else if (m_storage == STORAGE_BUFFER && m_aliasingStorages)
	{
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageBuf);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storageBuf);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buf");

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding same buffer object to buffer storages." << tcu::TestLog::EndMessage;
	}
	else if (m_storage == STORAGE_IMAGE && !m_aliasingStorages)
	{
		gl.bindImageTexture(1, m_storageTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buf");
	}
	else if (m_storage == STORAGE_IMAGE && m_aliasingStorages)
	{
		gl.bindImageTexture(1, m_storageTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32I);
		gl.bindImageTexture(2, m_storageTex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32I);

		GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buf");

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding same texture level to image storages." << tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(DE_FALSE);

	// destination
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_resultBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buf");

	// dispatch
	gl.dispatchCompute(groupsX, groupsY, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatchCompute");
}